

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O0

bool CompareStringFromCat(char *track,char *searched_string,char *search_ext)

{
  char *__s2;
  int iVar1;
  size_t __n;
  bool bVar2;
  bool local_36;
  int local_34;
  char local_2d;
  int i;
  char filename [9];
  char file_ext [4];
  char *search_ext_local;
  char *searched_string_local;
  char *track_local;
  
  unique0x100000f5 = search_ext;
  memset(filename + 1,0,4);
  filename[3] = track[10];
  filename._1_2_ = *(ushort *)(track + 8) & 0x7f7f;
  memset(&local_2d,0,9);
  local_34 = 0;
  while( true ) {
    bVar2 = false;
    if (local_34 < 8) {
      bVar2 = track[local_34] != ' ';
    }
    if (!bVar2) break;
    (&local_2d)[local_34] = track[local_34];
    local_34 = local_34 + 1;
  }
  iVar1 = strcasecmp(&local_2d,searched_string);
  __s2 = stack0xffffffffffffffe0;
  local_36 = false;
  if (iVar1 == 0) {
    __n = strlen(stack0xffffffffffffffe0);
    iVar1 = strncasecmp(filename + 1,__s2,__n);
    local_36 = iVar1 == 0;
  }
  return local_36;
}

Assistant:

bool CompareStringFromCat(const char* track, const char* searched_string, const char* search_ext)
{
   // Compare string
   char file_ext[4] = {0x0};
   memcpy(file_ext, &track[8], 3);
   file_ext[0] = file_ext[0] & 0x7F;
   file_ext[1] = file_ext[1] & 0x7F;
   char filename[9] = {0};
   for (int i = 0; i < 8 && track[i] != 0x20; i++)
      filename[i] = track[i];

   return (stricmp(filename, searched_string) == 0
      && strnicmp(file_ext, search_ext, strlen(search_ext)) == 0);
}